

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O2

size_t arangodb::velocypack::anon_unknown_0::JSONStringCopyC(uint8_t *dst,uint8_t *src,size_t limit)

{
  byte bVar1;
  size_t sVar2;
  
  for (sVar2 = 0;
      (((src + sVar2 < src + limit && (bVar1 = src[sVar2], 0x1f < bVar1)) && (bVar1 != 0x22)) &&
      (bVar1 != 0x5c)); sVar2 = sVar2 + 1) {
    dst[sVar2] = bVar1;
  }
  return sVar2;
}

Assistant:

inline std::size_t JSONStringCopyC(uint8_t* dst, uint8_t const* src,
                                   std::size_t limit) {
  // Copy up to limit uint8_t from src to dst.
  // Stop at the first control character or backslash or double quote.
  // Report the number of bytes copied. May copy less bytes, for example
  // for alignment reasons.
  uint8_t const* end = src + limit;
  while (src < end && *src >= 32 && *src != '\\' && *src != '"') {
    *dst++ = *src++;
  }
  return limit - (end - src);
}